

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_perf.c
# Opt level: O3

void write_is_done(void *vdata)

{
  int iVar1;
  void *__ptr;
  long lVar2;
  long lVar3;
  
  free((void *)**(undefined8 **)((long)vdata + 8));
  __ptr = *(void **)((long)vdata + 0x18);
  if (__ptr != (void *)0x0) {
    iVar1 = *(int *)((long)vdata + 0x10);
    if (0 < iVar1) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        if (*(void **)((long)__ptr + lVar2) != (void *)**(undefined8 **)((long)vdata + 8)) {
          free(*(void **)((long)__ptr + lVar2));
          __ptr = *(void **)((long)vdata + 0x18);
          *(undefined8 *)((long)__ptr + lVar2) = 0;
          iVar1 = *(int *)((long)vdata + 0x10);
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x10;
      } while (lVar3 < iVar1);
    }
    free(__ptr);
  }
  free(*(void **)((long)vdata + 8));
  free(vdata);
  return;
}

Assistant:

static void
write_is_done(void *vdata)
{
    struct _free_struct *data = (struct _free_struct *)vdata;
    int count;

    free(data->write_vec[0].iov_base);
    if (data->tmp_vec) {
	for (count = 0; count < data->vecs; count++) {
	    if (data->tmp_vec[count].iov_base == data->write_vec[0].iov_base) {
		continue;
	    }
	    free(data->tmp_vec[count].iov_base);
	    data->tmp_vec[count].iov_base = NULL;
	}
	free(data->tmp_vec);
    }
    free(data->write_vec);
    free(data);
}